

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

double __thiscall amrex::BoxArray::d_numPts(BoxArray *this)

{
  long *plVar1;
  undefined8 uVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int dir_1;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  double dVar17;
  IntVect IVar18;
  Box result;
  Box bx;
  undefined8 local_88;
  uint uStack_80;
  uint auStack_7c [2];
  undefined8 uStack_74;
  Box local_68;
  int local_48 [3];
  double local_38;
  
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar15 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data;
  uVar16 = (int)((long)*(pointer *)
                        ((long)&(peVar3->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) - lVar15 >> 2) * -0x49249249;
  switch((this->m_bat).m_bat_type) {
  case null:
    if (0 < (int)uVar16) {
      dVar17 = 0.0;
      lVar14 = 0;
      do {
        uVar2 = *(undefined8 *)(lVar15 + 0xc + lVar14);
        dVar17 = dVar17 + (double)((*(int *)(lVar15 + 0x14 + lVar14) - *(int *)(lVar15 + 8 + lVar14)
                                   ) + 1) *
                          (double)(((int)((ulong)uVar2 >> 0x20) -
                                   (int)((ulong)*(undefined8 *)(lVar15 + lVar14) >> 0x20)) + 1) *
                          (double)(((int)uVar2 - (int)*(undefined8 *)(lVar15 + lVar14)) + 1);
        lVar14 = lVar14 + 0x1c;
      } while ((ulong)(uVar16 & 0x7fffffff) * 0x1c != lVar14);
      return dVar17;
    }
    goto LAB_00480f61;
  case indexType:
  case indexType_coarsenRatio:
    uVar13 = *(uint *)&(this->m_bat).m_op;
    break;
  case coarsenRatio:
    uVar13 = 0;
    break;
  case bndryReg:
    if (0 < (int)uVar16) {
      uVar12 = (ulong)(uVar16 & 0x7fffffff);
      local_38 = 0.0;
      lVar15 = 0;
      do {
        BATbndryReg::operator()
                  (&local_68,&(this->m_bat).m_op.m_bndryReg,
                   (Box *)(*(long *)&(peVar3->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + lVar15));
        local_38 = local_38 +
                   (double)((local_68.bigend.vect[2] - local_68.smallend.vect[2]) + 1) *
                   (double)((local_68.bigend.vect[1] - local_68.smallend.vect[1]) + 1) *
                   (double)((local_68.bigend.vect[0] - local_68.smallend.vect[0]) + 1);
        lVar15 = lVar15 + 0x1c;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      return local_38;
    }
    goto LAB_00480f61;
  default:
    uVar13 = *(uint *)((long)&(this->m_bat).m_op + 4);
  }
  IVar18 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar11 = IVar18.vect[2];
  local_48[0] = IVar18.vect[0];
  local_48[1] = IVar18.vect[1];
  local_48[2] = IVar18.vect[2];
  if ((int)uVar16 < 1) {
LAB_00480f61:
    dVar17 = 0.0;
  }
  else {
    lVar15 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data;
    local_48[0] = IVar18.vect[0];
    local_48[1] = IVar18.vect[1];
    dVar17 = 0.0;
    uVar12 = 0;
    do {
      plVar1 = (long *)(lVar15 + uVar12 * 0x1c);
      lVar14 = *plVar1;
      lVar4 = plVar1[1];
      plVar1 = (long *)(lVar15 + 0xc + uVar12 * 0x1c);
      lVar5 = *plVar1;
      lVar6 = plVar1[1];
      auStack_7c[1] = (uint)((ulong)lVar5 >> 0x20);
      uStack_74 = lVar6;
      uStack_80 = (uint)lVar4;
      auStack_7c[0] = (uint)((ulong)lVar4 >> 0x20);
      local_88 = lVar14;
      if (iVar11 != 1 || (local_48[1] != 1 || local_48[0] != 1)) {
        local_88._0_4_ = (uint)lVar14;
        if (local_48[0] != 1) {
          if (local_48[0] == 4) {
            if ((int)(uint)local_88 < 0) {
              local_88._0_4_ = (uint)local_88 + 1;
              uVar9 = -(uint)local_88;
              if (0 < (int)(uint)local_88) {
                uVar9 = (uint)local_88;
              }
              uVar9 = uVar9 >> 2;
LAB_00480ae1:
              local_88._0_4_ = ~uVar9;
            }
            else {
              local_88._0_4_ = (uint)local_88 >> 2;
            }
          }
          else if (local_48[0] == 2) {
            if ((int)(uint)local_88 < 0) {
              local_88._0_4_ = (uint)local_88 + 1;
              uVar9 = -(uint)local_88;
              if (0 < (int)(uint)local_88) {
                uVar9 = (uint)local_88;
              }
              uVar9 = uVar9 >> 1;
              goto LAB_00480ae1;
            }
            local_88._0_4_ = (uint)local_88 >> 1;
          }
          else if ((int)(uint)local_88 < 0) {
            iVar8 = (uint)local_88 + 1;
            iVar7 = -iVar8;
            if (0 < iVar8) {
              iVar7 = iVar8;
            }
            local_88._0_4_ = ~(iVar7 / local_48[0]);
          }
          else {
            local_88._0_4_ = (int)(uint)local_88 / local_48[0];
          }
        }
        local_88._4_4_ = (uint)((ulong)lVar14 >> 0x20);
        if (local_48[1] != 1) {
          if (local_48[1] == 4) {
            if (lVar14 < 0) {
              local_88._4_4_ = local_88._4_4_ + 1;
              uVar9 = -local_88._4_4_;
              if (0 < (int)local_88._4_4_) {
                uVar9 = local_88._4_4_;
              }
              uVar9 = uVar9 >> 2;
LAB_00480b45:
              local_88._4_4_ = ~uVar9;
            }
            else {
              local_88._4_4_ = local_88._4_4_ >> 2;
            }
          }
          else if (local_48[1] == 2) {
            if (lVar14 < 0) {
              local_88._4_4_ = local_88._4_4_ + 1;
              uVar9 = -local_88._4_4_;
              if (0 < (int)local_88._4_4_) {
                uVar9 = local_88._4_4_;
              }
              uVar9 = uVar9 >> 1;
              goto LAB_00480b45;
            }
            local_88._4_4_ = local_88._4_4_ >> 1;
          }
          else if (lVar14 < 0) {
            iVar8 = local_88._4_4_ + 1;
            iVar7 = -iVar8;
            if (0 < iVar8) {
              iVar7 = iVar8;
            }
            local_88._4_4_ = ~(iVar7 / local_48[1]);
          }
          else {
            local_88._4_4_ = (int)local_88._4_4_ / local_48[1];
          }
        }
        if (iVar11 != 1) {
          if (iVar11 == 4) {
            if ((int)uStack_80 < 0) {
              uStack_80 = uStack_80 + 1;
              uVar9 = -uStack_80;
              if (0 < (int)uStack_80) {
                uVar9 = uStack_80;
              }
              uVar9 = uVar9 >> 2;
LAB_00480ba6:
              uStack_80 = ~uVar9;
            }
            else {
              uStack_80 = uStack_80 >> 2;
            }
          }
          else if (iVar11 == 2) {
            if ((int)uStack_80 < 0) {
              uStack_80 = uStack_80 + 1;
              uVar9 = -uStack_80;
              if (0 < (int)uStack_80) {
                uVar9 = uStack_80;
              }
              uVar9 = uVar9 >> 1;
              goto LAB_00480ba6;
            }
            uStack_80 = uStack_80 >> 1;
          }
          else if ((int)uStack_80 < 0) {
            iVar8 = uStack_80 + 1;
            iVar7 = -iVar8;
            if (0 < iVar8) {
              iVar7 = iVar8;
            }
            uStack_80 = ~(iVar7 / iVar11);
          }
          else {
            uStack_80 = (int)uStack_80 / iVar11;
          }
        }
        uStack_74._4_4_ = (uint)((ulong)lVar6 >> 0x20);
        uStack_74._0_4_ = (uint)lVar6;
        if (uStack_74._4_4_ == 0) {
          if (local_48[0] != 1) {
            if (local_48[0] == 4) {
              if (lVar4 < 0) {
                auStack_7c[0] = auStack_7c[0] + 1;
                uVar9 = -auStack_7c[0];
                if (0 < (int)auStack_7c[0]) {
                  uVar9 = auStack_7c[0];
                }
                uVar9 = uVar9 >> 2;
LAB_00480e70:
                auStack_7c[0] = ~uVar9;
              }
              else {
                auStack_7c[0] = auStack_7c[0] >> 2;
              }
            }
            else if (local_48[0] == 2) {
              if (lVar4 < 0) {
                auStack_7c[0] = auStack_7c[0] + 1;
                uVar9 = -auStack_7c[0];
                if (0 < (int)auStack_7c[0]) {
                  uVar9 = auStack_7c[0];
                }
                uVar9 = uVar9 >> 1;
                goto LAB_00480e70;
              }
              auStack_7c[0] = auStack_7c[0] >> 1;
            }
            else if (lVar4 < 0) {
              iVar8 = auStack_7c[0] + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              auStack_7c[0] = ~(iVar7 / local_48[0]);
            }
            else {
              auStack_7c[0] = (int)auStack_7c[0] / local_48[0];
            }
          }
          if (local_48[1] != 1) {
            if (local_48[1] == 4) {
              if (lVar5 < 0) {
                auStack_7c[1] = auStack_7c[1] + 1;
                uVar9 = -auStack_7c[1];
                if (0 < (int)auStack_7c[1]) {
                  uVar9 = auStack_7c[1];
                }
                uVar9 = uVar9 >> 2;
LAB_00480ed5:
                auStack_7c[1] = ~uVar9;
              }
              else {
                auStack_7c[1] = auStack_7c[1] >> 2;
              }
            }
            else if (local_48[1] == 2) {
              if (lVar5 < 0) {
                auStack_7c[1] = auStack_7c[1] + 1;
                uVar9 = -auStack_7c[1];
                if (0 < (int)auStack_7c[1]) {
                  uVar9 = auStack_7c[1];
                }
                uVar9 = uVar9 >> 1;
                goto LAB_00480ed5;
              }
              auStack_7c[1] = auStack_7c[1] >> 1;
            }
            else if (lVar5 < 0) {
              iVar8 = auStack_7c[1] + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              auStack_7c[1] = ~(iVar7 / local_48[1]);
            }
            else {
              auStack_7c[1] = (int)auStack_7c[1] / local_48[1];
            }
          }
          if (iVar11 != 1) {
            if (iVar11 == 4) {
              if ((int)(uint)uStack_74 < 0) {
                uStack_74._0_4_ = (uint)uStack_74 + 1;
                uVar9 = -(uint)uStack_74;
                if (0 < (int)(uint)uStack_74) {
                  uVar9 = (uint)uStack_74;
                }
                uVar9 = uVar9 >> 2;
LAB_00480f43:
                uStack_74._0_4_ = ~uVar9;
              }
              else {
                uStack_74._0_4_ = (uint)uStack_74 >> 2;
              }
            }
            else if (iVar11 == 2) {
              if ((int)(uint)uStack_74 < 0) {
                uStack_74._0_4_ = (uint)uStack_74 + 1;
                uVar9 = -(uint)uStack_74;
                if (0 < (int)(uint)uStack_74) {
                  uVar9 = (uint)uStack_74;
                }
                uVar9 = uVar9 >> 1;
                goto LAB_00480f43;
              }
              uStack_74._0_4_ = (uint)uStack_74 >> 1;
            }
            else if ((int)(uint)uStack_74 < 0) {
              iVar8 = (uint)uStack_74 + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              uStack_74._0_4_ = ~(iVar7 / iVar11);
            }
            else {
              uStack_74._0_4_ = (int)(uint)uStack_74 / iVar11;
            }
          }
        }
        else {
          local_68.smallend.vect[0] = 0;
          local_68.smallend.vect[1] = 0;
          local_68.smallend.vect[2] = 0;
          lVar14 = 0;
          do {
            if (((uStack_74._4_4_ >> ((uint)lVar14 & 0x1f) & 1) != 0) &&
               ((int)auStack_7c[lVar14] % local_48[lVar14] != 0)) {
              local_68.smallend.vect[lVar14] = 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          if (local_48[0] != 1) {
            if (local_48[0] == 4) {
              if (lVar4 < 0) {
                auStack_7c[0] = auStack_7c[0] + 1;
                uVar9 = -auStack_7c[0];
                if (0 < (int)auStack_7c[0]) {
                  uVar9 = auStack_7c[0];
                }
                uVar9 = uVar9 >> 2;
LAB_00480c9b:
                auStack_7c[0] = ~uVar9;
              }
              else {
                auStack_7c[0] = auStack_7c[0] >> 2;
              }
            }
            else if (local_48[0] == 2) {
              if (lVar4 < 0) {
                auStack_7c[0] = auStack_7c[0] + 1;
                uVar9 = -auStack_7c[0];
                if (0 < (int)auStack_7c[0]) {
                  uVar9 = auStack_7c[0];
                }
                uVar9 = uVar9 >> 1;
                goto LAB_00480c9b;
              }
              auStack_7c[0] = auStack_7c[0] >> 1;
            }
            else if (lVar4 < 0) {
              iVar8 = auStack_7c[0] + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              auStack_7c[0] = ~(iVar7 / local_48[0]);
            }
            else {
              auStack_7c[0] = (int)auStack_7c[0] / local_48[0];
            }
          }
          if (local_48[1] != 1) {
            if (local_48[1] == 4) {
              if (lVar5 < 0) {
                auStack_7c[1] = auStack_7c[1] + 1;
                uVar9 = -auStack_7c[1];
                if (0 < (int)auStack_7c[1]) {
                  uVar9 = auStack_7c[1];
                }
                uVar9 = uVar9 >> 2;
LAB_00480d02:
                auStack_7c[1] = ~uVar9;
              }
              else {
                auStack_7c[1] = auStack_7c[1] >> 2;
              }
            }
            else if (local_48[1] == 2) {
              if (lVar5 < 0) {
                auStack_7c[1] = auStack_7c[1] + 1;
                uVar9 = -auStack_7c[1];
                if (0 < (int)auStack_7c[1]) {
                  uVar9 = auStack_7c[1];
                }
                uVar9 = uVar9 >> 1;
                goto LAB_00480d02;
              }
              auStack_7c[1] = auStack_7c[1] >> 1;
            }
            else if (lVar5 < 0) {
              iVar8 = auStack_7c[1] + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              auStack_7c[1] = ~(iVar7 / local_48[1]);
            }
            else {
              auStack_7c[1] = (int)auStack_7c[1] / local_48[1];
            }
          }
          if (iVar11 != 1) {
            if (iVar11 == 4) {
              if ((int)(uint)uStack_74 < 0) {
                uStack_74._0_4_ = (uint)uStack_74 + 1;
                uVar9 = -(uint)uStack_74;
                if (0 < (int)(uint)uStack_74) {
                  uVar9 = (uint)uStack_74;
                }
                uVar9 = uVar9 >> 2;
LAB_00480d63:
                uStack_74._0_4_ = ~uVar9;
              }
              else {
                uStack_74._0_4_ = (uint)uStack_74 >> 2;
              }
            }
            else if (iVar11 == 2) {
              if ((int)(uint)uStack_74 < 0) {
                uStack_74._0_4_ = (uint)uStack_74 + 1;
                uVar9 = -(uint)uStack_74;
                if (0 < (int)(uint)uStack_74) {
                  uVar9 = (uint)uStack_74;
                }
                uVar9 = uVar9 >> 1;
                goto LAB_00480d63;
              }
              uStack_74._0_4_ = (uint)uStack_74 >> 1;
            }
            else if ((int)(uint)uStack_74 < 0) {
              iVar8 = (uint)uStack_74 + 1;
              iVar7 = -iVar8;
              if (0 < iVar8) {
                iVar7 = iVar8;
              }
              uStack_74._0_4_ = ~(iVar7 / iVar11);
            }
            else {
              uStack_74._0_4_ = (int)(uint)uStack_74 / iVar11;
            }
          }
          auStack_7c[0] = auStack_7c[0] + local_68.smallend.vect[0];
          auStack_7c[1] = auStack_7c[1] + local_68.smallend.vect[1];
          uStack_74._0_4_ = (uint)uStack_74 + local_68.smallend.vect[2];
        }
      }
      local_68.bigend.vect[1] = auStack_7c[1];
      local_68.bigend.vect[2] = (uint)uStack_74;
      local_68.btype.itype = uStack_74._4_4_;
      local_68.bigend.vect[0] = auStack_7c[0];
      lVar14 = 0;
      do {
        uVar9 = 1 << ((byte)lVar14 & 0x1f);
        uVar10 = (uint)lVar14;
        local_68.bigend.vect[lVar14] =
             (local_68.bigend.vect[lVar14] + (uint)((uVar13 >> (uVar10 & 0x1f) & 1) != 0)) -
             (uint)((local_68.btype.itype >> (uVar10 & 0x1f) & 1) != 0);
        if ((uVar13 >> (uVar10 & 0x1f) & 1) == 0) {
          local_68.btype.itype = ~uVar9 & local_68.btype.itype;
        }
        else {
          local_68.btype.itype = uVar9 | local_68.btype.itype;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      dVar17 = dVar17 + (double)(int)((local_68.bigend.vect[2] - uStack_80) + 1) *
                        (double)((local_68.bigend.vect[1] - (int)((ulong)local_88 >> 0x20)) + 1) *
                        (double)((local_68.bigend.vect[0] - (int)local_88) + 1);
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uVar16 & 0x7fffffff));
  }
  return dVar17;
}

Assistant:

double
BoxArray::d_numPts () const noexcept
{
    double result = 0;
    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += bxs[i].d_numPts();
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += amrex::convert(amrex::coarsen(bxs[i],cr),t).d_numPts();
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += m_bat.m_op.m_bndryReg(bxs[i]).d_numPts();
        }
    }

    return result;
}